

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O3

void __thiscall Assimp::MDL::HalfLife::HL1MDLLoader::read_global_info(HL1MDLLoader *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *pppaVar2;
  bool bVar3;
  iterator __position;
  Header_HL1 *pHVar4;
  size_type sVar5;
  aiNode *this_00;
  aiMetadata *paVar6;
  aiString *paVar7;
  aiMetadataEntry *__s;
  undefined4 *puVar8;
  int32_t *piVar9;
  int *piVar10;
  long *plVar11;
  HL1MDLLoader *pHVar12;
  int32_t iVar13;
  int iVar14;
  ulong uVar15;
  aiString *paVar16;
  uint uVar17;
  aiNode *global_info_node;
  string local_70;
  float local_4c;
  HL1MDLLoader *local_48;
  undefined8 uStack_40;
  aiNode *local_38;
  
  this_00 = (aiNode *)operator_new(0x478);
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"<MDL_global_info>","");
  aiNode::aiNode(this_00,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  __position._M_current =
       (this->rootnode_children_).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_38 = this_00;
  if (__position._M_current ==
      (this->rootnode_children_).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*const&>
              ((vector<aiNode*,std::allocator<aiNode*>> *)&this->rootnode_children_,__position,
               &local_38);
  }
  else {
    *__position._M_current = this_00;
    pppaVar2 = &(this->rootnode_children_).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppaVar2 = *pppaVar2 + 1;
  }
  bVar3 = this->import_settings_->read_misc_global_info;
  uVar17 = (uint)bVar3 + (uint)bVar3 * 4 + 0xb;
  local_48 = this;
  paVar6 = (aiMetadata *)operator_new(0x18);
  paVar6->mNumProperties = uVar17;
  uVar15 = (ulong)(uVar17 * 0x400 + ((uint)bVar3 + (uint)bVar3 * 4) * 4 + 0x2c);
  paVar7 = (aiString *)operator_new__(uVar15);
  paVar16 = paVar7;
  do {
    paVar16->length = 0;
    paVar16->data[0] = '\0';
    memset(paVar16->data + 1,0x1b,0x3ff);
    paVar16 = paVar16 + 1;
  } while (paVar16 != (aiString *)(paVar7->data + (uVar15 - 4)));
  paVar6->mKeys = paVar7;
  __s = (aiMetadataEntry *)operator_new__((ulong)(uVar17 * 0x10));
  memset(__s,0,(ulong)(uVar17 * 0x10));
  paVar6->mValues = __s;
  local_38->mMetaData = paVar6;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Version","");
  pHVar12 = local_48;
  sVar5 = local_70._M_string_length;
  if ((paVar6->mNumProperties != 0) && (local_70._M_string_length != 0)) {
    if (local_70._M_string_length < 0x400) {
      paVar16 = paVar6->mKeys;
      paVar16->length = (ai_uint32)local_70._M_string_length;
      memcpy(paVar16->data,local_70._M_dataplus._M_p,local_70._M_string_length);
      paVar16->data[sVar5] = '\0';
    }
    paVar6->mValues->mType = AI_INT32;
    puVar8 = (undefined4 *)operator_new(4);
    *puVar8 = 10;
    paVar6->mValues->mData = puVar8;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"NumBodyparts","");
  sVar5 = local_70._M_string_length;
  if ((1 < paVar6->mNumProperties) && (local_70._M_string_length != 0)) {
    pHVar4 = pHVar12->header_;
    if (local_70._M_string_length < 0x400) {
      paVar16 = paVar6->mKeys;
      paVar16[1].length = (ai_uint32)local_70._M_string_length;
      memcpy(paVar16[1].data,local_70._M_dataplus._M_p,local_70._M_string_length);
      paVar16[1].data[sVar5] = '\0';
      pHVar12 = local_48;
    }
    paVar6->mValues[1].mType = AI_INT32;
    piVar9 = (int32_t *)operator_new(4);
    *piVar9 = pHVar4->numbodyparts;
    paVar6->mValues[1].mData = piVar9;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"NumModels","");
  sVar5 = local_70._M_string_length;
  if ((2 < paVar6->mNumProperties) && (local_70._M_string_length != 0)) {
    if (local_70._M_string_length < 0x400) {
      paVar16 = paVar6->mKeys;
      paVar16[2].length = (ai_uint32)local_70._M_string_length;
      memcpy(paVar16[2].data,local_70._M_dataplus._M_p,local_70._M_string_length);
      paVar16[2].data[sVar5] = '\0';
    }
    paVar6->mValues[2].mType = AI_INT32;
    piVar10 = (int *)operator_new(4);
    *piVar10 = pHVar12->total_models_;
    paVar6->mValues[2].mData = piVar10;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"NumBones","");
  sVar5 = local_70._M_string_length;
  if ((3 < paVar6->mNumProperties) && (local_70._M_string_length != 0)) {
    pHVar4 = pHVar12->header_;
    if (local_70._M_string_length < 0x400) {
      paVar16 = paVar6->mKeys;
      paVar16[3].length = (ai_uint32)local_70._M_string_length;
      memcpy(paVar16[3].data,local_70._M_dataplus._M_p,local_70._M_string_length);
      paVar16[3].data[sVar5] = '\0';
      pHVar12 = local_48;
    }
    paVar6->mValues[3].mType = AI_INT32;
    piVar9 = (int32_t *)operator_new(4);
    *piVar9 = pHVar4->numbones;
    paVar6->mValues[3].mData = piVar9;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"NumAttachments","");
  sVar5 = local_70._M_string_length;
  iVar13 = 0;
  if (pHVar12->import_settings_->read_attachments == true) {
    iVar13 = pHVar12->header_->numattachments;
  }
  if ((4 < paVar6->mNumProperties) && (local_70._M_string_length != 0)) {
    if (local_70._M_string_length < 0x400) {
      paVar16 = paVar6->mKeys;
      paVar16[4].length = (ai_uint32)local_70._M_string_length;
      memcpy(paVar16[4].data,local_70._M_dataplus._M_p,local_70._M_string_length);
      paVar16[4].data[sVar5] = '\0';
      pHVar12 = local_48;
    }
    paVar6->mValues[4].mType = AI_INT32;
    piVar9 = (int32_t *)operator_new(4);
    *piVar9 = iVar13;
    paVar6->mValues[4].mData = piVar9;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"NumSkinFamilies","");
  sVar5 = local_70._M_string_length;
  if ((5 < paVar6->mNumProperties) && (local_70._M_string_length != 0)) {
    pHVar4 = pHVar12->texture_header_;
    if (local_70._M_string_length < 0x400) {
      paVar16 = paVar6->mKeys;
      paVar16[5].length = (ai_uint32)local_70._M_string_length;
      memcpy(paVar16[5].data,local_70._M_dataplus._M_p,local_70._M_string_length);
      paVar16[5].data[sVar5] = '\0';
      pHVar12 = local_48;
    }
    paVar6->mValues[5].mType = AI_INT32;
    piVar9 = (int32_t *)operator_new(4);
    *piVar9 = pHVar4->numskinfamilies;
    paVar6->mValues[5].mData = piVar9;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"NumHitboxes","");
  sVar5 = local_70._M_string_length;
  iVar13 = 0;
  if (pHVar12->import_settings_->read_hitboxes == true) {
    iVar13 = pHVar12->header_->numhitboxes;
  }
  if ((6 < paVar6->mNumProperties) && (local_70._M_string_length != 0)) {
    if (local_70._M_string_length < 0x400) {
      paVar16 = paVar6->mKeys;
      paVar16[6].length = (ai_uint32)local_70._M_string_length;
      memcpy(paVar16[6].data,local_70._M_dataplus._M_p,local_70._M_string_length);
      paVar16[6].data[sVar5] = '\0';
      pHVar12 = local_48;
    }
    paVar6->mValues[6].mType = AI_INT32;
    piVar9 = (int32_t *)operator_new(4);
    *piVar9 = iVar13;
    paVar6->mValues[6].mData = piVar9;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"NumBoneControllers","");
  sVar5 = local_70._M_string_length;
  iVar13 = 0;
  if (pHVar12->import_settings_->read_bone_controllers == true) {
    iVar13 = pHVar12->header_->numbonecontrollers;
  }
  if ((7 < paVar6->mNumProperties) && (local_70._M_string_length != 0)) {
    if (local_70._M_string_length < 0x400) {
      paVar16 = paVar6->mKeys;
      paVar16[7].length = (ai_uint32)local_70._M_string_length;
      memcpy(paVar16[7].data,local_70._M_dataplus._M_p,local_70._M_string_length);
      paVar16[7].data[sVar5] = '\0';
      pHVar12 = local_48;
    }
    paVar6->mValues[7].mType = AI_INT32;
    piVar9 = (int32_t *)operator_new(4);
    *piVar9 = iVar13;
    paVar6->mValues[7].mData = piVar9;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"NumSequences","");
  sVar5 = local_70._M_string_length;
  iVar13 = 0;
  if (pHVar12->import_settings_->read_animations == true) {
    iVar13 = pHVar12->header_->numseq;
  }
  if ((8 < paVar6->mNumProperties) && (local_70._M_string_length != 0)) {
    if (local_70._M_string_length < 0x400) {
      paVar16 = paVar6->mKeys;
      paVar16[8].length = (ai_uint32)local_70._M_string_length;
      memcpy(paVar16[8].data,local_70._M_dataplus._M_p,local_70._M_string_length);
      paVar16[8].data[sVar5] = '\0';
      pHVar12 = local_48;
    }
    paVar6->mValues[8].mType = AI_INT32;
    piVar9 = (int32_t *)operator_new(4);
    *piVar9 = iVar13;
    paVar6->mValues[8].mData = piVar9;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"NumBlendControllers","");
  sVar5 = local_70._M_string_length;
  iVar14 = 0;
  if (pHVar12->import_settings_->read_blend_controllers != false) {
    iVar14 = pHVar12->num_blend_controllers_;
  }
  if ((9 < paVar6->mNumProperties) && (local_70._M_string_length != 0)) {
    if (local_70._M_string_length < 0x400) {
      paVar16 = paVar6->mKeys;
      paVar16[9].length = (ai_uint32)local_70._M_string_length;
      memcpy(paVar16[9].data,local_70._M_dataplus._M_p,local_70._M_string_length);
      paVar16[9].data[sVar5] = '\0';
      pHVar12 = local_48;
    }
    paVar6->mValues[9].mType = AI_INT32;
    piVar10 = (int *)operator_new(4);
    *piVar10 = iVar14;
    paVar6->mValues[9].mData = piVar10;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"NumTransitionNodes","");
  sVar5 = local_70._M_string_length;
  iVar13 = 0;
  if (pHVar12->import_settings_->read_sequence_transitions == true) {
    iVar13 = pHVar12->header_->numtransitions;
  }
  if ((10 < paVar6->mNumProperties) && (local_70._M_string_length != 0)) {
    if (local_70._M_string_length < 0x400) {
      paVar16 = paVar6->mKeys;
      paVar16[10].length = (ai_uint32)local_70._M_string_length;
      memcpy(paVar16[10].data,local_70._M_dataplus._M_p,local_70._M_string_length);
      paVar16[10].data[sVar5] = '\0';
      pHVar12 = local_48;
    }
    paVar6->mValues[10].mType = AI_INT32;
    piVar9 = (int32_t *)operator_new(4);
    *piVar9 = iVar13;
    paVar6->mValues[10].mData = piVar9;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (pHVar12->import_settings_->read_misc_global_info == true) {
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"EyePosition","");
    sVar5 = local_70._M_string_length;
    if ((0xb < paVar6->mNumProperties) && (local_70._M_string_length != 0)) {
      local_48 = *(HL1MDLLoader **)pHVar12->header_->eyeposition;
      uStack_40 = 0;
      local_4c = pHVar12->header_->eyeposition[2];
      if (local_70._M_string_length < 0x400) {
        paVar16 = paVar6->mKeys;
        paVar16[0xb].length = (ai_uint32)local_70._M_string_length;
        memcpy(paVar16[0xb].data,local_70._M_dataplus._M_p,local_70._M_string_length);
        paVar16[0xb].data[sVar5] = '\0';
      }
      paVar6->mValues[0xb].mType = AI_AIVECTOR3D;
      plVar11 = (long *)operator_new(0xc);
      *plVar11 = (long)local_48;
      *(float *)(plVar11 + 1) = local_4c;
      paVar6->mValues[0xb].mData = plVar11;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"HullMin","");
    sVar5 = local_70._M_string_length;
    if ((0xc < paVar6->mNumProperties) && (local_70._M_string_length != 0)) {
      local_48 = *(HL1MDLLoader **)pHVar12->header_->min;
      uStack_40 = 0;
      local_4c = pHVar12->header_->min[2];
      if (local_70._M_string_length < 0x400) {
        paVar16 = paVar6->mKeys;
        paVar16[0xc].length = (ai_uint32)local_70._M_string_length;
        memcpy(paVar16[0xc].data,local_70._M_dataplus._M_p,local_70._M_string_length);
        paVar16[0xc].data[sVar5] = '\0';
      }
      paVar6->mValues[0xc].mType = AI_AIVECTOR3D;
      plVar11 = (long *)operator_new(0xc);
      *plVar11 = (long)local_48;
      *(float *)(plVar11 + 1) = local_4c;
      paVar6->mValues[0xc].mData = plVar11;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"HullMax","");
    sVar5 = local_70._M_string_length;
    if ((0xd < paVar6->mNumProperties) && (local_70._M_string_length != 0)) {
      local_48 = *(HL1MDLLoader **)pHVar12->header_->max;
      uStack_40 = 0;
      local_4c = pHVar12->header_->max[2];
      if (local_70._M_string_length < 0x400) {
        paVar16 = paVar6->mKeys;
        paVar16[0xd].length = (ai_uint32)local_70._M_string_length;
        memcpy(paVar16[0xd].data,local_70._M_dataplus._M_p,local_70._M_string_length);
        paVar16[0xd].data[sVar5] = '\0';
      }
      paVar6->mValues[0xd].mType = AI_AIVECTOR3D;
      plVar11 = (long *)operator_new(0xc);
      *plVar11 = (long)local_48;
      *(float *)(plVar11 + 1) = local_4c;
      paVar6->mValues[0xd].mData = plVar11;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CollisionMin","");
    sVar5 = local_70._M_string_length;
    if ((0xe < paVar6->mNumProperties) && (local_70._M_string_length != 0)) {
      local_48 = *(HL1MDLLoader **)pHVar12->header_->bbmin;
      uStack_40 = 0;
      local_4c = pHVar12->header_->bbmin[2];
      if (local_70._M_string_length < 0x400) {
        paVar16 = paVar6->mKeys;
        paVar16[0xe].length = (ai_uint32)local_70._M_string_length;
        memcpy(paVar16[0xe].data,local_70._M_dataplus._M_p,local_70._M_string_length);
        paVar16[0xe].data[sVar5] = '\0';
      }
      paVar6->mValues[0xe].mType = AI_AIVECTOR3D;
      plVar11 = (long *)operator_new(0xc);
      *plVar11 = (long)local_48;
      *(float *)(plVar11 + 1) = local_4c;
      paVar6->mValues[0xe].mData = plVar11;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    local_70._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CollisionMax","");
    if ((0xf < paVar6->mNumProperties) && (local_70._M_string_length != 0)) {
      local_48 = *(HL1MDLLoader **)pHVar12->header_->bbmax;
      uStack_40 = 0;
      local_4c = pHVar12->header_->bbmax[2];
      if (local_70._M_string_length < 0x400) {
        paVar16 = paVar6->mKeys;
        paVar16[0xf].length = (ai_uint32)local_70._M_string_length;
        memcpy(paVar16[0xf].data,local_70._M_dataplus._M_p,local_70._M_string_length);
        paVar16[0xf].data[local_70._M_string_length] = '\0';
      }
      paVar6->mValues[0xf].mType = AI_AIVECTOR3D;
      plVar11 = (long *)operator_new(0xc);
      *plVar11 = (long)local_48;
      *(float *)(plVar11 + 1) = local_4c;
      paVar6->mValues[0xf].mData = plVar11;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void HL1MDLLoader::read_global_info() {
    aiNode *global_info_node = new aiNode(AI_MDL_HL1_NODE_GLOBAL_INFO);
    rootnode_children_.push_back(global_info_node);

    aiMetadata *md = global_info_node->mMetaData = aiMetadata::Alloc(import_settings_.read_misc_global_info ? 16 : 11);
    md->Set(0, "Version", AI_MDL_HL1_VERSION);
    md->Set(1, "NumBodyparts", header_->numbodyparts);
    md->Set(2, "NumModels", total_models_);
    md->Set(3, "NumBones", header_->numbones);
    md->Set(4, "NumAttachments", import_settings_.read_attachments ? header_->numattachments : 0);
    md->Set(5, "NumSkinFamilies", texture_header_->numskinfamilies);
    md->Set(6, "NumHitboxes", import_settings_.read_hitboxes ? header_->numhitboxes : 0);
    md->Set(7, "NumBoneControllers", import_settings_.read_bone_controllers ? header_->numbonecontrollers : 0);
    md->Set(8, "NumSequences", import_settings_.read_animations ? header_->numseq : 0);
    md->Set(9, "NumBlendControllers", import_settings_.read_blend_controllers ? num_blend_controllers_ : 0);
    md->Set(10, "NumTransitionNodes", import_settings_.read_sequence_transitions ? header_->numtransitions : 0);

    if (import_settings_.read_misc_global_info) {
        md->Set(11, "EyePosition", aiVector3D(header_->eyeposition[0], header_->eyeposition[1], header_->eyeposition[2]));
        md->Set(12, "HullMin", aiVector3D(header_->min[0], header_->min[1], header_->min[2]));
        md->Set(13, "HullMax", aiVector3D(header_->max[0], header_->max[1], header_->max[2]));
        md->Set(14, "CollisionMin", aiVector3D(header_->bbmin[0], header_->bbmin[1], header_->bbmin[2]));
        md->Set(15, "CollisionMax", aiVector3D(header_->bbmax[0], header_->bbmax[1], header_->bbmax[2]));
    }
}